

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

void __thiscall
testing::internal::
VariadicMatcher<testing::internal::AllOfMatcherImpl,testing::internal::GeMatcher<char>,testing::internal::LeMatcher<char>>
::CreateVariadicMatcher<char_const&,0ul>
          (VariadicMatcher<testing::internal::AllOfMatcherImpl,testing::internal::GeMatcher<char>,testing::internal::LeMatcher<char>>
           *this,vector<testing::Matcher<char_const&>,std::allocator<testing::Matcher<char_const&>>>
                 *values)

{
  MatcherBase<const_char_&> local_28;
  
  local_28.vtable_ =
       (VTable *)
       MatcherBase<char_const&>::
       GetVTable<testing::internal::MatcherBase<char_const&>::ValuePolicy<testing::internal::GeMatcher<char>,true>>()
       ::kVTable;
  local_28.buffer_.i._0_1_ = this[1];
  local_28.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00269b70;
  std::vector<testing::Matcher<char_const&>,std::allocator<testing::Matcher<char_const&>>>::
  emplace_back<testing::Matcher<char_const&>>(values,(Matcher<const_char_&> *)&local_28);
  MatcherBase<const_char_&>::~MatcherBase(&local_28);
  CreateVariadicMatcher<char_const&,1ul>(this,values);
  return;
}

Assistant:

void CreateVariadicMatcher(std::vector<Matcher<T> >* values,
                             std::integral_constant<size_t, I>) const {
    values->push_back(SafeMatcherCast<T>(std::get<I>(matchers_)));
    CreateVariadicMatcher<T>(values, std::integral_constant<size_t, I + 1>());
  }